

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O1

int AF_A_IceSetTics(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *thing;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  PClass *pPVar7;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005daddf;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    thing = (AActor *)(param->field_0).field_1.a;
    pVVar8 = param;
    uVar5 = numparam;
    if (thing != (AActor *)0x0) {
      if ((thing->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
        (thing->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar7 = (thing->super_DThinker).super_DObject.Class;
      bVar9 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar9;
      uVar5 = (uint)bVar9;
      pVVar8 = (VMValue *)(ulong)(pPVar7 == pPVar3 || bVar9);
      if (pPVar7 != pPVar3 && !bVar9) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar3) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005daddf;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005dadb4;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar6 = (**(code **)*puVar2)(puVar2,pVVar8,uVar5,ret);
          puVar2[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar2[1];
        bVar9 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar3 && bVar9) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar9 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar3) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005daddf;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      uVar5 = FRandom::GenRand32(&pr_icesettics);
      thing->tics = (uVar5 & 0x3f) + 0x46;
      iVar4 = P_GetThingFloorType(thing);
      iVar4 = Terrains.Array[iVar4].DamageMOD.Index;
      if (iVar4 == 0x33) {
        iVar4 = thing->tics * 2;
      }
      else {
        if (iVar4 != 0x9f) {
          return 0;
        }
        iVar4 = thing->tics >> 2;
      }
      thing->tics = iVar4;
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005dadb4:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005daddf:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                ,0xf6,"int AF_A_IceSetTics(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_IceSetTics)
{
	PARAM_ACTION_PROLOGUE;

	int floor;

	self->tics = 70+(pr_icesettics()&63);
	floor = P_GetThingFloorType (self);
	if (Terrains[floor].DamageMOD == NAME_Fire)
	{
		self->tics >>= 2;
	}
	else if (Terrains[floor].DamageMOD == NAME_Ice)
	{
		self->tics <<= 1;
	}
	return 0;
}